

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

double * __thiscall Network::predict(Network *this,double *inputs,size_t length)

{
  Layer *pLVar1;
  Matrix *pMVar2;
  ulong uVar3;
  double *pdVar4;
  size_t sVar5;
  ulong uVar6;
  
  if ((*this->layers)->nodeCount == length) {
    if (length != 0) {
      pdVar4 = (*this->layers)->neurons;
      sVar5 = 0;
      do {
        pdVar4[sVar5] = inputs[sVar5];
        sVar5 = sVar5 + 1;
      } while (length != sVar5);
    }
    uVar3 = this->layerCount;
    if (1 < uVar3) {
      uVar6 = 1;
      do {
        pLVar1 = this->layers[uVar6 - 1];
        pMVar2 = Matrix::multiply(this->layers[uVar6]->weights,pLVar1->neurons,pLVar1->nodeCount);
        pMVar2 = Matrix::add(pMVar2,this->layers[uVar6]->biases,this->layers[uVar6]->nodeCount);
        pLVar1 = this->layers[uVar6];
        Matrix::apply(pMVar2,pLVar1->func,pLVar1->neurons,pLVar1->nodeCount);
        Matrix::~Matrix(pMVar2);
        operator_delete(pMVar2,0x18);
        uVar6 = uVar6 + 1;
        uVar3 = this->layerCount;
      } while (uVar6 < uVar3);
    }
    pdVar4 = this->layers[uVar3 - 1]->neurons;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Inputs don\'t match Input Model Layer",0x24);
    pdVar4 = (double *)0x0;
  }
  return pdVar4;
}

Assistant:

double* Network::predict(double* inputs, size_t length) const {
	if (length != layers[0]->nodeCount) {
		std::cout << "Inputs don't match Input Model Layer";
		return nullptr;
	}

	/* Set the input layer neurons to the passed inputs */
	for (size_t i = 0; i < length; ++i) {
		layers[0]->neurons[i] = inputs[i];
	}

	/* Feed forward algorithm */
	for (size_t i = 1; i < layerCount; i++) {
		/*
		 * 1. Multiply previous Neurons with current index I weights to get new Neuron Matrix for index I
		 * 2. add() bias to calclulated neurons
		 * 3. apply() Activation Function to squeeze numbers to specific regions
		 */
		Matrix* unmappedMatrix = Matrix::multiply(layers[i]->weights, layers[i - 1]->neurons, layers[i - 1]->nodeCount)
			->add(layers[i]->biases, layers[i]->nodeCount);
		unmappedMatrix->apply(layers[i]->func, layers[i]->neurons, layers[i]->nodeCount);
		delete unmappedMatrix;
	}

	/* Return predicted output which are just the last neurons */
	return layers[layerCount - 1]->neurons;
}